

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

uint nk_check_flags_text(nk_context *ctx,char *text,int len,uint flags,uint value)

{
  nk_bool nVar1;
  uint uVar2;
  
  uVar2 = flags;
  if (text != (char *)0x0 && ctx != (nk_context *)0x0) {
    nVar1 = nk_check_text(ctx,text,len,value & flags);
    uVar2 = ~value & flags;
    if (nVar1 != 0) {
      uVar2 = value | flags;
    }
  }
  return uVar2;
}

Assistant:

NK_API unsigned int
nk_check_flags_text(struct nk_context *ctx, const char *text, int len,
unsigned int flags, unsigned int value)
{
int old_active;
NK_ASSERT(ctx);
NK_ASSERT(text);
if (!ctx || !text) return flags;
old_active = (int)((flags & value) & value);
if (nk_check_text(ctx, text, len, old_active))
flags |= value;
else flags &= ~value;
return flags;
}